

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_IsInstanceOf(JSContext *ctx,JSValue val,JSValue obj)

{
  JSValue val_00;
  JSValue this_obj;
  JSValue v;
  JSValue v_00;
  JSValue func_obj;
  JSValue val_01;
  JSValue obj_00;
  JSValue val_02;
  int iVar1;
  JSValueUnion in_RCX;
  JSValue *in_RSI;
  JSContext *in_RDI;
  JSValueUnion in_R8;
  JSValue JVar2;
  int64_t unaff_retaddr;
  JSValue ret;
  JSValue method;
  JSAtom in_stack_0000009c;
  JSContext *in_stack_000000a0;
  undefined1 in_stack_000000a8 [16];
  undefined1 in_stack_000000b8 [16];
  BOOL in_stack_00000140;
  JSValueUnion local_98;
  JSValueUnion local_90;
  undefined8 in_stack_ffffffffffffff78;
  int argc;
  JSContext *in_stack_ffffffffffffff80;
  JSValueUnion JVar3;
  JSValueUnion JVar4;
  JSValueUnion JVar5;
  JSValueUnion JVar6;
  JSValueUnion ctx_00;
  JSValueUnion JVar7;
  JSValueUnion JVar8;
  JSValueUnion JVar9;
  
  argc = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  JVar2.tag = (int64_t)in_R8.ptr;
  JVar2.u.ptr = in_RCX.ptr;
  iVar1 = JS_IsObject(JVar2);
  if (iVar1 != 0) {
    ctx_00 = in_RCX;
    JVar7 = in_R8;
    JVar2 = JS_GetPropertyInternal
                      (in_stack_000000a0,(JSValue)in_stack_000000b8,in_stack_0000009c,
                       (JSValue)in_stack_000000a8,in_stack_00000140);
    JVar3 = JVar2.u;
    JVar4 = (JSValueUnion)JVar2.tag;
    JVar5 = JVar3;
    JVar6 = JVar4;
    JVar8 = JVar3;
    JVar9 = JVar4;
    iVar1 = JS_IsException(JVar2);
    if (iVar1 != 0) {
      return -1;
    }
    v.tag = (int64_t)JVar6.ptr;
    v.u.ptr = JVar5.ptr;
    iVar1 = JS_IsNull(v);
    if ((iVar1 == 0) &&
       (v_00.tag = (int64_t)JVar6.ptr, v_00.u.ptr = JVar5.ptr, iVar1 = JS_IsUndefined(v_00),
       iVar1 == 0)) {
      func_obj.tag = (int64_t)JVar6.ptr;
      func_obj.u.ptr = JVar5.ptr;
      this_obj.tag = (int64_t)JVar4.ptr;
      this_obj.u.ptr = JVar3.ptr;
      JVar2 = JS_CallFree(in_stack_ffffffffffffff80,func_obj,this_obj,argc,in_RSI);
      local_98 = JVar2.u;
      local_90 = (JSValueUnion)JVar2.tag;
      val_00.tag = (int64_t)JVar3.ptr;
      val_00.u = (JSValueUnion)(JSValueUnion)local_90.ptr;
      iVar1 = JS_ToBoolFree((JSContext *)local_98.ptr,val_00);
      return iVar1;
    }
    val_01.tag = (int64_t)in_R8.ptr;
    val_01.u.ptr = in_RCX.ptr;
    iVar1 = JS_IsFunction(in_RDI,val_01);
    if (iVar1 != 0) {
      val_02.tag = unaff_retaddr;
      val_02.u.float64 = JVar9.float64;
      obj_00.tag = (int64_t)JVar8.ptr;
      obj_00.u.float64 = JVar7.float64;
      iVar1 = JS_OrdinaryIsInstanceOf((JSContext *)ctx_00.ptr,val_02,obj_00);
      return iVar1;
    }
  }
  JS_ThrowTypeError(in_RDI,"invalid \'instanceof\' right operand");
  return -1;
}

Assistant:

int JS_IsInstanceOf(JSContext *ctx, JSValueConst val, JSValueConst obj)
{
    JSValue method;

    if (!JS_IsObject(obj))
        goto fail;
    method = JS_GetProperty(ctx, obj, JS_ATOM_Symbol_hasInstance);
    if (JS_IsException(method))
        return -1;
    if (!JS_IsNull(method) && !JS_IsUndefined(method)) {
        JSValue ret;
        ret = JS_CallFree(ctx, method, obj, 1, &val);
        return JS_ToBoolFree(ctx, ret);
    }

    /* legacy case */
    if (!JS_IsFunction(ctx, obj)) {
    fail:
        JS_ThrowTypeError(ctx, "invalid 'instanceof' right operand");
        return -1;
    }
    return JS_OrdinaryIsInstanceOf(ctx, val, obj);
}